

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void rec_wont(connectdata *conn,int option)

{
  int iVar1;
  void *pvVar2;
  TELNET *tn;
  int option_local;
  connectdata *conn_local;
  
  pvVar2 = (conn->data->req).protop;
  switch(*(undefined4 *)((long)pvVar2 + (long)option * 4 + 0xc08)) {
  case 0:
    break;
  case 1:
    *(undefined4 *)((long)pvVar2 + (long)option * 4 + 0xc08) = 0;
    send_negotiation(conn,0xfe,option);
    break;
  case 2:
    iVar1 = *(int *)((long)pvVar2 + (long)option * 4 + 0x1008);
    if (iVar1 == 0) {
      *(undefined4 *)((long)pvVar2 + (long)option * 4 + 0xc08) = 0;
    }
    else if (iVar1 == 1) {
      *(undefined4 *)((long)pvVar2 + (long)option * 4 + 0xc08) = 0;
      *(undefined4 *)((long)pvVar2 + (long)option * 4 + 0x1008) = 0;
    }
    break;
  case 3:
    iVar1 = *(int *)((long)pvVar2 + (long)option * 4 + 0x1008);
    if (iVar1 == 0) {
      *(undefined4 *)((long)pvVar2 + (long)option * 4 + 0xc08) = 0;
    }
    else if (iVar1 == 1) {
      *(undefined4 *)((long)pvVar2 + (long)option * 4 + 0xc08) = 2;
      *(undefined4 *)((long)pvVar2 + (long)option * 4 + 0x1008) = 0;
      send_negotiation(conn,0xfd,option);
    }
  }
  return;
}

Assistant:

static
void rec_wont(struct connectdata *conn, int option)
{
  struct TELNET *tn = (struct TELNET *)conn->data->req.protop;
  switch(tn->him[option]) {
  case CURL_NO:
    /* Already disabled */
    break;

  case CURL_YES:
    tn->him[option] = CURL_NO;
    send_negotiation(conn, CURL_DONT, option);
    break;

  case CURL_WANTNO:
    switch(tn->himq[option]) {
    case CURL_EMPTY:
      tn->him[option] = CURL_NO;
      break;

    case CURL_OPPOSITE:
      tn->him[option] = CURL_WANTYES;
      tn->himq[option] = CURL_EMPTY;
      send_negotiation(conn, CURL_DO, option);
      break;
    }
    break;

  case CURL_WANTYES:
    switch(tn->himq[option]) {
    case CURL_EMPTY:
      tn->him[option] = CURL_NO;
      break;
    case CURL_OPPOSITE:
      tn->him[option] = CURL_NO;
      tn->himq[option] = CURL_EMPTY;
      break;
    }
    break;
  }
}